

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_set_options.c
# Opt level: O2

wchar_t archive_set_format_option(archive *_a,char *m,char *o,char *v)

{
  code *pcVar1;
  int iVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  archive_string_conv **ppaVar5;
  long lVar6;
  bool bVar7;
  int local_40;
  wchar_t local_3c;
  
  ppaVar5 = &_a[4].sconv;
  local_40 = 0;
  local_3c = L'\xffffffec';
  lVar6 = 0x10;
  do {
    bVar7 = lVar6 == 0;
    lVar6 = lVar6 + -1;
    if (bVar7) {
      wVar4 = L'\xffffffeb';
      if (local_40 != 0) {
        wVar4 = local_3c;
      }
      if (m == (char *)0x0) {
        wVar4 = local_3c;
      }
      return wVar4;
    }
    pcVar1 = (code *)ppaVar5[3];
    wVar4 = local_3c;
    if ((pcVar1 != (code *)0x0) && (ppaVar5[1] != (archive_string_conv *)0x0)) {
      if (m != (char *)0x0) {
        iVar2 = strcmp((char *)ppaVar5[1],m);
        if (iVar2 != 0) goto LAB_00113c0c;
        local_40 = local_40 + 1;
      }
      _a[0xe].error_string.length = (size_t)ppaVar5;
      wVar3 = (*pcVar1)(_a,o,v);
      _a[0xe].error_string.length = 0;
      wVar4 = wVar3;
      if ((wVar3 != L'\0') && (wVar4 = local_3c, wVar3 == L'\xffffffe2')) {
        return L'\xffffffe2';
      }
    }
LAB_00113c0c:
    local_3c = wVar4;
    ppaVar5 = ppaVar5 + 0xb;
  } while( true );
}

Assistant:

static int
archive_set_format_option(struct archive *_a, const char *m, const char *o,
    const char *v)
{
	struct archive_read *a = (struct archive_read *)_a;
	size_t i;
	int r, rv = ARCHIVE_WARN, matched_modules = 0;

	for (i = 0; i < sizeof(a->formats)/sizeof(a->formats[0]); i++) {
		struct archive_format_descriptor *format = &a->formats[i];

		if (format->options == NULL || format->name == NULL)
			/* This format does not support option. */
			continue;
		if (m != NULL) {
			if (strcmp(format->name, m) != 0)
				continue;
			++matched_modules;
		}

		a->format = format;
		r = format->options(a, o, v);
		a->format = NULL;

		if (r == ARCHIVE_FATAL)
			return (ARCHIVE_FATAL);

		if (r == ARCHIVE_OK)
			rv = ARCHIVE_OK;
	}
	/* If the format name didn't match, return a special code for
	 * _archive_set_option[s]. */
	if (m != NULL && matched_modules == 0)
		return ARCHIVE_WARN - 1;
	return (rv);
}